

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileave3_naive_matches_regular_::run
          (Test_bitileave_ileave3_naive_matches_regular_ *this)

{
  SourceLocation loc;
  bool bVar1;
  uint __b;
  enable_if_t<isStringifieable<unsigned_long_long>,_std::string> local_14c8;
  undefined1 local_14a6;
  undefined1 local_14a5;
  undefined1 local_1491;
  enable_if_t<isStringifieable<unsigned_long_long>,_std::string> local_1490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1410;
  string_view local_13f0;
  undefined4 local_13dc;
  enable_if_t<areUnsigned<unsigned_int,_unsigned_int,_unsigned_int>,_ull_type> eStack_13d8;
  Cmp cmp_;
  unsigned_long_long *local_13d0;
  enable_if_t<areUnsigned<unsigned_int,_unsigned_int,_unsigned_int>,_ull_type> *tr_;
  enable_if_t<areUnsigned<unsigned_int,_unsigned_int,_unsigned_int>,_ull_type> **local_13c0;
  enable_if_t<areUnsigned<unsigned_int>,_unsigned_long_long> *tl_;
  result_type_conflict local_13b0;
  uint32_t v [3];
  size_t i;
  uniform_int_distribution<unsigned_int> distr;
  mt19937 rng;
  Test_bitileave_ileave3_naive_matches_regular_ *this_local;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&distr,0x3039);
  __b = std::numeric_limits<unsigned_int>::max();
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&i,0,__b);
  v[1] = 0;
  v[2] = 0;
  while( true ) {
    if (0x3ff < (ulong)v._4_8_) {
      return;
    }
    tl_._4_4_ = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&i,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&distr);
    local_13b0 = std::uniform_int_distribution<unsigned_int>::operator()
                           ((uniform_int_distribution<unsigned_int> *)&i,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)&distr);
    v[0] = std::uniform_int_distribution<unsigned_int>::operator()
                     ((uniform_int_distribution<unsigned_int> *)&i,
                      (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                       *)&distr);
    tr_ = (enable_if_t<areUnsigned<unsigned_int,_unsigned_int,_unsigned_int>,_ull_type> *)
          ileave<unsigned_int,3ul>((uint (*) [3])((long)&tl_ + 4));
    local_13c0 = &tr_;
    eStack_13d8 = detail::ileave_naive<unsigned_int,unsigned_int,unsigned_int>
                            (tl_._4_4_,local_13b0,v[0]);
    local_13d0 = &stack0xffffffffffffec28;
    local_13dc = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long_long,unsigned_long_long>
                      ((unsigned_long_long *)local_13c0,local_13d0);
    local_1491 = 0;
    local_14a5 = 0;
    local_14a6 = 0;
    if (!bVar1) break;
    local_1491 = 0;
    local_14a5 = 0;
    local_14a6 = 0;
    v._4_8_ = v._4_8_ + 1;
  }
  stringify<unsigned_long_long>(&local_1490,(unsigned_long_long *)local_13c0);
  local_1491 = 1;
  std::operator+(&local_1470,
                 "Comparison failed: ileave(v) == detail::ileave_naive(v[0], v[1], v[2]) (with \"ileave(v)\"="
                 ,&local_1490);
  local_14a5 = 1;
  std::operator+(&local_1450,&local_1470,", \"detail::ileave_naive(v[0], v[1], v[2])\"=");
  local_14a6 = 1;
  stringify<unsigned_long_long>(&local_14c8,local_13d0);
  std::operator+(&local_1430,&local_1450,&local_14c8);
  std::operator+(&local_1410,&local_1430,")");
  local_13f0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1410);
  loc.function = "run";
  loc.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc.line = 0x103;
  assertFail(local_13f0,loc);
}

Assistant:

BITMANIP_TEST(bitileave, ileave3_naive_matches_regular)
{
    std::mt19937 rng{12345};
    std::uniform_int_distribution<std::uint32_t> distr{0, std::numeric_limits<std::uint32_t>::max()};

    for (size_t i = 0; i < 1024 * 1; ++i) {
        std::uint32_t v[] = {distr(rng), distr(rng), distr(rng)};
        BITMANIP_ASSERT_EQ(ileave(v), detail::ileave_naive(v[0], v[1], v[2]));
    }
}